

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortHelper.cpp
# Opt level: O3

void Kernel::SortHelper::collectVariableSortsIter
               (CollectTask task,
               DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *map,
               bool ignoreBound)

{
  uint uVar1;
  uint64_t uVar2;
  Formula *pFVar3;
  bool bVar4;
  uint uVar5;
  TermList TVar6;
  CollectTask *pCVar7;
  OperatorType *pOVar8;
  ulong uVar9;
  socklen_t sVar10;
  OperatorKey *pOVar11;
  anon_union_8_4_8765d89c_for_CollectTask_1 *paVar12;
  anon_union_8_4_8765d89c_for_CollectTask_1 aVar13;
  Term *term;
  Term *pTVar14;
  undefined7 in_register_00000031;
  anon_union_8_2_f154dc0f_for_Term_10 *paVar15;
  anon_union_8_2_f154dc0f_for_Term_10 aVar16;
  uint *puVar17;
  uint *puVar18;
  Substitution subst;
  Stack<Kernel::SortHelper::CollectTask> local_c8;
  undefined4 local_9c;
  Term *local_98;
  Array<int> local_90;
  uint *local_78;
  undefined8 local_70;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *local_68;
  Substitution local_60;
  uint *local_38;
  
  local_9c = (undefined4)CONCAT71(in_register_00000031,ignoreBound);
  local_c8._cursor = (CollectTask *)0x0;
  local_c8._end = (CollectTask *)0x0;
  local_c8._capacity = 0;
  local_c8._stack = (CollectTask *)0x0;
  local_90._capacity = 0x1f;
  local_68 = map;
  local_90._array = (int *)::operator_new(0x80,0x10);
  local_90._vptr_Array = (_func_int **)&PTR_fillInterval_00b3b9e8;
  local_90._array[0x1b] = 0;
  local_90._array[0x1c] = 0;
  local_90._array[0x1d] = 0;
  local_90._array[0x1e] = 0;
  local_90._array[0x18] = 0;
  local_90._array[0x19] = 0;
  local_90._array[0x1a] = 0;
  local_90._array[0x1b] = 0;
  local_90._array[0x14] = 0;
  local_90._array[0x15] = 0;
  local_90._array[0x16] = 0;
  local_90._array[0x17] = 0;
  local_90._array[0x10] = 0;
  local_90._array[0x11] = 0;
  local_90._array[0x12] = 0;
  local_90._array[0x13] = 0;
  local_90._array[0xc] = 0;
  local_90._array[0xd] = 0;
  local_90._array[0xe] = 0;
  local_90._array[0xf] = 0;
  local_90._array[8] = 0;
  local_90._array[9] = 0;
  local_90._array[10] = 0;
  local_90._array[0xb] = 0;
  local_90._array[4] = 0;
  local_90._array[5] = 0;
  local_90._array[6] = 0;
  local_90._array[7] = 0;
  local_90._array[0] = 0;
  local_90._array[1] = 0;
  local_90._array[2] = 0;
  local_90._array[3] = 0;
  if (local_c8._cursor == local_c8._end) {
    Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
  }
  ((local_c8._cursor)->contextSort)._content = task.contextSort._content;
  (local_c8._cursor)->fncTag = task.fncTag;
  *(undefined4 *)&(local_c8._cursor)->field_0x4 = task._4_4_;
  *(undefined4 *)&(local_c8._cursor)->field_1 = task.field_1.ts._content._0_4_;
  *(undefined4 *)((long)&(local_c8._cursor)->field_1 + 4) = task.field_1.ts._content._4_4_;
  pCVar7 = local_c8._cursor + 1;
switchD_005b8fd6_default:
  do {
    local_c8._cursor = pCVar7;
    if (local_c8._cursor == local_c8._stack) {
      Lib::Array<int>::~Array(&local_90);
      if (local_c8._stack != (CollectTask *)0x0) {
        uVar9 = local_c8._capacity * 0x18 + 0xf & 0xfffffffffffffff0;
        if (uVar9 == 0) {
          *(undefined8 *)local_c8._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_c8._stack;
        }
        else if (uVar9 < 0x11) {
          *(undefined8 *)local_c8._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_c8._stack;
        }
        else if (uVar9 < 0x19) {
          *(undefined8 *)local_c8._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_c8._stack;
        }
        else if (uVar9 < 0x21) {
          *(undefined8 *)local_c8._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_c8._stack;
        }
        else if (uVar9 < 0x31) {
          *(undefined8 *)local_c8._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_c8._stack;
        }
        else if (uVar9 < 0x41) {
          *(undefined8 *)local_c8._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_c8._stack;
        }
        else {
          operator_delete(local_c8._stack,0x10);
        }
      }
      return;
    }
    pCVar7 = local_c8._cursor + -1;
  } while (UNBIND < local_c8._cursor[-1].fncTag);
  pTVar14 = local_c8._cursor[-1].field_1.t;
  switch(local_c8._cursor[-1].fncTag) {
  case COLLECT_TERM:
    uVar5 = *(uint *)&pTVar14->field_0xc & 0xfffffff;
    aVar16 = *(anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar14->_args + uVar5);
    if ((aVar16._vars & 3) != 2) {
      paVar15 = (anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar14->_args + ((ulong)uVar5 - 1));
      uVar5 = 0;
      local_c8._cursor = pCVar7;
      do {
        TVar6 = getArgSort(pTVar14,uVar5);
        if (local_c8._cursor == local_c8._end) {
          Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
        }
        (local_c8._cursor)->fncTag = COLLECT_TERMLIST;
        ((local_c8._cursor)->field_1).ts._content = (uint64_t)aVar16;
        ((local_c8._cursor)->contextSort)._content = TVar6._content;
        local_c8._cursor = local_c8._cursor + 1;
        aVar16 = *paVar15;
        paVar15 = paVar15 + -1;
        uVar5 = uVar5 + 1;
        pCVar7 = local_c8._cursor;
      } while ((aVar16._vars & 3) != 2);
    }
    goto switchD_005b8fd6_default;
  case COLLECT_TERMLIST:
    TVar6._content = local_c8._cursor[-1].contextSort._content;
    if (((uint)pTVar14 & 3) == 1) {
      uVar5 = (uint)((ulong)pTVar14 >> 2);
      local_c8._cursor = pCVar7;
      if ((char)local_9c != '\0') {
        uVar9 = (ulong)(int)uVar5;
        if (local_90._capacity <= uVar9) {
          Lib::Array<int>::expandToFit(&local_90,uVar9);
        }
        pCVar7 = local_c8._cursor;
        if (local_90._array[uVar9] != 0) goto switchD_005b8fd6_default;
      }
      Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                (local_68,uVar5,TVar6);
      pCVar7 = local_c8._cursor;
      goto switchD_005b8fd6_default;
    }
    if (((ulong)pTVar14 & 3) != 0) goto switchD_005b8fd6_default;
    uVar5 = pTVar14->_functor;
    local_c8._cursor = pCVar7;
    if (pCVar7 == local_c8._end) {
      Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
    }
    (local_c8._cursor)->fncTag = (uint)(0xfffffff8 < uVar5) * 2;
    ((local_c8._cursor)->field_1).t = pTVar14;
    ((local_c8._cursor)->contextSort)._content = TVar6._content;
    break;
  case COLLECT_SPECIALTERM:
    if (pTVar14->_functor < 0xfffffff9) goto switchD_005b8fd6_default;
    puVar18 = &pTVar14[-1]._functor;
    switch(pTVar14->_functor) {
    case 0xfffffff9:
      goto switchD_005b8f16_caseD_fffffff9;
    case 0xfffffffa:
      aVar13 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)&pTVar14[-1]._functor;
      TVar6._content = pTVar14[-1]._args[0]._content;
      local_c8._cursor = pCVar7;
      if (pCVar7 == local_c8._end) {
        Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
      }
      (local_c8._cursor)->fncTag = COLLECT_TERMLIST;
      break;
    case 0xfffffffb:
      local_98 = *(Term **)&pTVar14[-1]._maxRedLen;
      local_60._map._timestamp = 1;
      local_60._map._20_8_ = 0;
      local_60._map._28_8_ = 0;
      local_60._map._size = 0;
      local_60._map._deleted = 0;
      local_60._map._capacityIndex = 0;
      local_60._map._capacity = 0;
      local_60._map._afterLast._4_4_ = 0;
      puVar17 = *(uint **)&pTVar14[-1]._weight;
      local_c8._cursor = pCVar7;
      local_78 = puVar18;
      pOVar8 = Signature::Symbol::fnType
                         (*(Symbol **)
                           (*(long *)(DAT_00b521b0 + 0x60) + (ulong)pTVar14[-1]._functor * 8));
      pOVar11 = pOVar8->_key;
      if ((pOVar8->_typeArgsArity - 1) + *(int *)pOVar11 == 0) goto LAB_005b92aa;
      uVar5 = 0;
      goto LAB_005b920c;
    case 0xfffffffc:
      aVar13 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)puVar18;
      local_c8._cursor = pCVar7;
      if (pCVar7 == local_c8._end) {
        Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
      }
      (local_c8._cursor)->fncTag = COLLECT_TERM;
      goto LAB_005b96f6;
    case 0xfffffffd:
      aVar13 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)puVar18;
      local_c8._cursor = pCVar7;
      if (pCVar7 == local_c8._end) {
        Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
      }
      goto LAB_005b96f0;
    case 0xfffffffe:
      local_98 = *(Term **)&pTVar14[-1]._maxRedLen;
      local_c8._cursor = pCVar7;
      local_78 = puVar18;
      if ((((ulong)local_98 & 3) == 0) && (bVar4 = Term::isBoolean(local_98), bVar4)) {
        puVar18 = *(uint **)&pTVar14[-1]._weight;
        local_60._map._timestamp = 1;
        local_60._map._20_8_ = 0;
        local_60._map._28_8_ = 0;
        local_60._map._size = 0;
        local_60._map._deleted = 0;
        local_60._map._capacityIndex = 0;
        local_60._map._capacity = 0;
        local_60._map._afterLast._4_4_ = 0;
        pOVar8 = Signature::Symbol::predType
                           (*(Symbol **)
                             (*(long *)(DAT_00b521b0 + 0x80) + (ulong)pTVar14[-1]._functor * 8));
        local_70 = (uint *)CONCAT44(local_70._4_4_,
                                    (int)CONCAT71((int7)((ulong)&pTVar14[-1]._weight >> 8),1));
      }
      else {
        puVar18 = *(uint **)&pTVar14[-1]._weight;
        local_60._map._timestamp = 1;
        local_60._map._20_8_ = 0;
        local_60._map._28_8_ = 0;
        local_60._map._size = 0;
        local_60._map._deleted = 0;
        local_60._map._capacityIndex = 0;
        local_60._map._capacity = 0;
        local_60._map._afterLast._4_4_ = 0;
        pOVar8 = Signature::Symbol::fnType
                           (*(Symbol **)
                             (*(long *)(DAT_00b521b0 + 0x60) + (ulong)pTVar14[-1]._functor * 8));
        local_70 = (uint *)((ulong)local_70._4_4_ << 0x20);
      }
      local_38 = &pTVar14[-1]._weight;
      pOVar11 = pOVar8->_key;
      if ((pOVar8->_typeArgsArity - 1) + *(int *)pOVar11 == 0) goto LAB_005b9603;
      uVar5 = 0;
      goto LAB_005b9565;
    case 0xffffffff:
      TVar6._content._0_4_ = pTVar14[-1]._weight;
      TVar6._content._4_4_ = pTVar14[-1]._kboWeight;
      aVar13 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)
                (pTVar14->_args + (*(uint *)&pTVar14->field_0xc & 0xfffffff));
      local_c8._cursor = pCVar7;
      if (pCVar7 == local_c8._end) {
        Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
      }
      (local_c8._cursor)->fncTag = COLLECT_TERMLIST;
      (local_c8._cursor)->field_1 = aVar13;
      ((local_c8._cursor)->contextSort)._content = TVar6._content;
      local_c8._cursor = local_c8._cursor + 1;
      aVar13 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)
                (pTVar14->_args + ((ulong)(*(uint *)&pTVar14->field_0xc & 0xfffffff) - 1));
      if (local_c8._cursor == local_c8._end) {
        Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
      }
      (local_c8._cursor)->fncTag = COLLECT_TERMLIST;
      (local_c8._cursor)->field_1 = aVar13;
      ((local_c8._cursor)->contextSort)._content = TVar6._content;
      local_c8._cursor = local_c8._cursor + 1;
      aVar13 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)puVar18;
      if (local_c8._cursor == local_c8._end) {
        Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
      }
      (local_c8._cursor)->fncTag = COLLECT_FORMULA;
    }
    (local_c8._cursor)->field_1 = aVar13;
LAB_005b93b3:
    ((local_c8._cursor)->contextSort)._content = TVar6._content;
    break;
  case COLLECT_FORMULA:
    switch(*(undefined4 *)&pTVar14->_vptr_Term) {
    case 0:
      pFVar3 = (Formula *)pTVar14->_args[0]._content;
      if (*(int *)((long)&(pFVar3->_label)._M_dataplus._M_p + 4) < 0) {
        aVar13 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)((long)&(pFVar3->_label).field_2 + 8)
        ;
        local_c8._cursor = pCVar7;
        TVar6 = AtomicSort::superSort();
        if (local_c8._cursor == local_c8._end) {
          Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
        }
        (local_c8._cursor)->fncTag = COLLECT_TERMLIST;
        (local_c8._cursor)->field_1 = aVar13;
        ((local_c8._cursor)->contextSort)._content = TVar6._content;
        pCVar7 = local_c8._cursor + 1;
      }
      local_c8._cursor = pCVar7;
      if (pCVar7 == local_c8._end) {
        Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
      }
      (local_c8._cursor)->fncTag = COLLECT_TERM;
      ((local_c8._cursor)->field_1).f = pFVar3;
      goto LAB_005b96fa;
    case 1:
    case 2:
      paVar12 = (anon_union_8_4_8765d89c_for_CollectTask_1 *)pTVar14->_args[0]._content;
      while (paVar12 != (anon_union_8_4_8765d89c_for_CollectTask_1 *)0x0) {
        aVar13 = *paVar12;
        paVar12 = (anon_union_8_4_8765d89c_for_CollectTask_1 *)paVar12[1].t;
        local_c8._cursor = pCVar7;
        if (pCVar7 == local_c8._end) {
          Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
        }
        (local_c8._cursor)->fncTag = COLLECT_FORMULA;
        (local_c8._cursor)->field_1 = aVar13;
        ((local_c8._cursor)->contextSort)._content = 2;
        pCVar7 = local_c8._cursor + 1;
      }
      goto switchD_005b8fd6_default;
    case 3:
    case 4:
    case 5:
      aVar13 = (anon_union_8_4_8765d89c_for_CollectTask_1)pTVar14->_args[0]._content;
      local_c8._cursor = pCVar7;
      if (pCVar7 == local_c8._end) {
        Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
      }
      (local_c8._cursor)->fncTag = COLLECT_FORMULA;
      (local_c8._cursor)->field_1 = aVar13;
      ((local_c8._cursor)->contextSort)._content = 2;
      local_c8._cursor = local_c8._cursor + 1;
      aVar13 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)(pTVar14 + 1);
      if (local_c8._cursor == local_c8._end) {
        Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
      }
      break;
    case 6:
      aVar13 = (anon_union_8_4_8765d89c_for_CollectTask_1)pTVar14->_args[0]._content;
      local_c8._cursor = pCVar7;
      if (pCVar7 == local_c8._end) {
        Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
      }
      break;
    case 7:
    case 8:
      if ((char)local_9c != '\0') {
        aVar13 = (anon_union_8_4_8765d89c_for_CollectTask_1)pTVar14->_args[0]._content;
        local_c8._cursor = pCVar7;
        if (pCVar7 == local_c8._end) {
          Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
        }
        (local_c8._cursor)->fncTag = UNBIND;
        (local_c8._cursor)->field_1 = aVar13;
        ((local_c8._cursor)->contextSort)._content = 2;
        pCVar7 = local_c8._cursor + 1;
      }
      aVar13 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)&pTVar14[1]._functor;
      local_c8._cursor = pCVar7;
      if (pCVar7 == local_c8._end) {
        Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
      }
      (local_c8._cursor)->fncTag = COLLECT_FORMULA;
      (local_c8._cursor)->field_1 = aVar13;
      ((local_c8._cursor)->contextSort)._content = 2;
      local_c8._cursor = local_c8._cursor + 1;
      pCVar7 = local_c8._cursor;
      if ((char)local_9c != '\0') {
        aVar13 = (anon_union_8_4_8765d89c_for_CollectTask_1)pTVar14->_args[0]._content;
        if (local_c8._cursor == local_c8._end) {
          Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
        }
        (local_c8._cursor)->fncTag = BIND;
        goto LAB_005b96f6;
      }
      goto switchD_005b8fd6_default;
    case 9:
      pTVar14 = (Term *)pTVar14->_args[0]._content;
      if (((ulong)pTVar14 & 1) == 0) {
        uVar5 = pTVar14->_functor;
        local_c8._cursor = pCVar7;
        TVar6 = AtomicSort::boolSort();
        if (local_c8._cursor == local_c8._end) {
          Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
        }
        (local_c8._cursor)->fncTag = (uint)(0xfffffff8 < uVar5) * 2;
        ((local_c8._cursor)->field_1).t = pTVar14;
        goto LAB_005b93b3;
      }
      local_c8._cursor = pCVar7;
      if ((char)local_9c != '\0') {
        uVar9 = (ulong)(int)((ulong)pTVar14 >> 2);
        if (local_90._capacity <= uVar9) {
          Lib::Array<int>::expandToFit(&local_90,uVar9);
        }
        pCVar7 = local_c8._cursor;
        if (local_90._array[uVar9] != 0) goto switchD_005b8fd6_default;
      }
      TVar6 = AtomicSort::boolSort();
      Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                (local_68,(uint)((ulong)pTVar14 >> 2),TVar6);
      pCVar7 = local_c8._cursor;
      goto switchD_005b8fd6_default;
    default:
      goto switchD_005b8fd6_default;
    }
LAB_005b96f0:
    (local_c8._cursor)->fncTag = COLLECT_FORMULA;
LAB_005b96f6:
    (local_c8._cursor)->field_1 = aVar13;
LAB_005b96fa:
    ((local_c8._cursor)->contextSort)._content = 2;
    break;
  case BIND:
    while (local_c8._cursor = pCVar7, pCVar7 = local_c8._cursor, pTVar14 != (Term *)0x0) {
      uVar9 = (ulong)*(int *)&pTVar14->_vptr_Term;
      pTVar14 = *(Term **)&pTVar14->_functor;
      if (local_90._capacity <= uVar9) {
        Lib::Array<int>::expandToFit(&local_90,uVar9);
      }
      local_90._array[uVar9] = local_90._array[uVar9] + 1;
      pCVar7 = local_c8._cursor;
    }
    goto switchD_005b8fd6_default;
  case UNBIND:
    while (local_c8._cursor = pCVar7, pCVar7 = local_c8._cursor, pTVar14 != (Term *)0x0) {
      uVar9 = (ulong)*(int *)&pTVar14->_vptr_Term;
      pTVar14 = *(Term **)&pTVar14->_functor;
      if (local_90._capacity <= uVar9) {
        Lib::Array<int>::expandToFit(&local_90,uVar9);
      }
      local_90._array[uVar9] = local_90._array[uVar9] + -1;
      pCVar7 = local_c8._cursor;
    }
    goto switchD_005b8fd6_default;
  }
  pCVar7 = local_c8._cursor + 1;
  goto switchD_005b8fd6_default;
LAB_005b9565:
  sVar10 = (socklen_t)pOVar11;
  uVar1 = *puVar18;
  uVar9 = (ulong)(int)uVar1;
  puVar18 = *(uint **)(puVar18 + 2);
  TVar6 = AtomicSort::superSort();
  if (uVar5 < pOVar8->_typeArgsArity) {
    Kernel::Substitution::bind
              (&local_60,uVar5 & 0x3fffffff,(sockaddr *)(ulong)(uVar1 * 4 + 1),sVar10);
  }
  else {
    TVar6 = SubstHelper::applyImpl<false,Kernel::Substitution>
                      (*(uint64_t *)(pOVar8->_key + (ulong)(uVar5 - pOVar8->_typeArgsArity) * 8 + 8)
                       ,&local_60,false);
  }
  if ((char)local_9c == '\0') {
LAB_005b95d9:
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              (local_68,uVar1,TVar6);
  }
  else {
    if (local_90._capacity <= uVar9) {
      Lib::Array<int>::expandToFit(&local_90,uVar9);
    }
    if (local_90._array[uVar9] == 0) goto LAB_005b95d9;
  }
  uVar5 = uVar5 + 1;
  pOVar11 = (OperatorKey *)(ulong)*(uint *)pOVar8->_key;
  if ((pOVar8->_typeArgsArity + *(uint *)pOVar8->_key) - 1 <= uVar5) {
LAB_005b9603:
    (*(code *)(&DAT_008facc8 + *(int *)(&DAT_008facc8 + (ulong)~pTVar14->_functor * 4)))();
    return;
  }
  goto LAB_005b9565;
LAB_005b920c:
  sVar10 = (socklen_t)pOVar11;
  uVar1 = *puVar17;
  uVar9 = (ulong)(int)uVar1;
  puVar17 = *(uint **)(puVar17 + 2);
  TVar6 = AtomicSort::superSort();
  if (uVar5 < pOVar8->_typeArgsArity) {
    Kernel::Substitution::bind
              (&local_60,uVar5 & 0x3fffffff,(sockaddr *)(ulong)(uVar1 * 4 + 1),sVar10);
  }
  else {
    TVar6 = SubstHelper::applyImpl<false,Kernel::Substitution>
                      (*(uint64_t *)(pOVar8->_key + (ulong)(uVar5 - pOVar8->_typeArgsArity) * 8 + 8)
                       ,&local_60,false);
  }
  if ((char)local_9c == '\0') {
LAB_005b9280:
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              (local_68,uVar1,TVar6);
  }
  else {
    if (local_90._capacity <= uVar9) {
      Lib::Array<int>::expandToFit(&local_90,uVar9);
    }
    if (local_90._array[uVar9] == 0) goto LAB_005b9280;
  }
  uVar5 = uVar5 + 1;
  pOVar11 = (OperatorKey *)(ulong)*(uint *)pOVar8->_key;
  if ((pOVar8->_typeArgsArity + *(uint *)pOVar8->_key) - 1 <= uVar5) {
LAB_005b92aa:
    (*(code *)(&DAT_008facac + *(int *)(&DAT_008facac + (ulong)~pTVar14->_functor * 4)))();
    return;
  }
  goto LAB_005b920c;
switchD_005b8f16_caseD_fffffff9:
  uVar2._0_4_ = pTVar14[-1]._weight;
  uVar2._4_4_ = pTVar14[-1]._kboWeight;
  aVar13 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)
            (pTVar14->_args + (*(uint *)&pTVar14->field_0xc & 0xfffffff));
  local_c8._cursor = pCVar7;
  if (pCVar7 == local_c8._end) {
    Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
  }
  (local_c8._cursor)->fncTag = COLLECT_TERMLIST;
  (local_c8._cursor)->field_1 = aVar13;
  ((local_c8._cursor)->contextSort)._content = uVar2;
  local_c8._cursor = local_c8._cursor + 1;
  uVar5 = *(uint *)&pTVar14->field_0xc & 0xfffffff;
  pCVar7 = local_c8._cursor;
  local_78 = puVar18;
  if (1 < uVar5) {
    local_70 = &pTVar14[-1]._weight;
    local_98 = (Term *)&pTVar14[-1].field_9;
    aVar13 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)(pTVar14->_args + ((ulong)uVar5 - 1));
    if (local_c8._cursor == local_c8._end) {
      Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_c8);
    }
    (local_c8._cursor)->fncTag = COLLECT_TERMLIST;
    (local_c8._cursor)->field_1 = aVar13;
    ((local_c8._cursor)->contextSort)._content = uVar2;
    local_c8._cursor = local_c8._cursor + 1;
    (*(code *)(&DAT_008fac90 + *(int *)(&DAT_008fac90 + (ulong)~pTVar14->_functor * 4)))();
    return;
  }
  goto switchD_005b8fd6_default;
}

Assistant:

void SortHelper::collectVariableSortsIter(CollectTask task, DHMap<unsigned,TermList>& map, bool ignoreBound)
{
  Stack<CollectTask> todo;
  MultiCounter bound;

  todo.push(task);
  while (todo.isNonEmpty()) {
    CollectTask task = todo.pop();

    switch(task.fncTag) {
      case COLLECT_TERM: {
        Term* term = task.t;
    
        unsigned position = 0;
        for (TermList* ts = term->args(); ts->isNonEmpty(); ts = ts->next()) {
          CollectTask newTask(COLLECT_TERMLIST);
          newTask.ts = *ts;
          newTask.contextSort = getArgSort(term, position++);
          todo.push(newTask);
        }

      } break;

      case COLLECT_TERMLIST: {
        TermList ts = task.ts;

        if (ts.isTerm()) {
          Term* term = ts.term();

          CollectTask newTask(term->isSpecial() ? COLLECT_SPECIALTERM : COLLECT_TERM);
          newTask.t = term;
          newTask.contextSort = task.contextSort;
          todo.push(newTask);
        } else if (ts.isOrdinaryVar()) {
          unsigned var = ts.var();
          if (!ignoreBound || !bound.get(var)) {
            if (!map.insert(var, task.contextSort)) {
              ASS_EQ(task.contextSort, map.get(var));
            }
          }
        }

      } break;

      case COLLECT_SPECIALTERM: {
        Term* term = task.t;

        ASS(term->isSpecial());

        Term::SpecialTermData* sd = term->getSpecialData();

        switch (term->specialFunctor()) {
          case SpecialFunctor::ITE: {
            CollectTask newTask(COLLECT_TERMLIST);
            newTask.contextSort = sd->getSort();

            newTask.ts = *term->nthArgument(0);
            todo.push(newTask);

            newTask.ts = *term->nthArgument(1);
            todo.push(newTask);

            newTask.fncTag = COLLECT_FORMULA;
            newTask.f = sd->getCondition();
            todo.push(newTask);

            break;
          }

          case SpecialFunctor::LET: {
            TermList binding = sd->getBinding();
            bool isPredicate = binding.isTerm() && binding.term()->isBoolean();
            Signature::Symbol* symbol = isPredicate ? env.signature->getPredicate(sd->getFunctor())
                                                    : env.signature->getFunction(sd->getFunctor());
            VList::Iterator vit(sd->getVariables());
            Substitution subst;
            auto type = isPredicate ? symbol->predType() : symbol->fnType();
            for (unsigned i = 0; i < type->arity(); i++) {
              ASS(vit.hasNext());
              auto var = vit.next();
              TermList sort = AtomicSort::superSort();
              if (i < type->numTypeArguments()) {
                subst.bind(type->quantifiedVar(i).var(), TermList(var, false));
              } else {
                sort = SubstHelper::apply(type->arg(i),subst);
              }
              if (!ignoreBound || !bound.get(var)) {
                if (!map.insert(var, sort)) {
                  ASS_EQ(sort, map.get(var));
                }
              }
            }

            CollectTask newTask(COLLECT_TERMLIST);
            newTask.contextSort = sd->getSort();

            newTask.ts = *term->nthArgument(0);
            todo.push(newTask);

            newTask.ts = binding;
            if (!isPredicate) {
              newTask.contextSort = SubstHelper::apply(type->result(),subst);
            }
            todo.push(newTask);

            break;
          }

          case SpecialFunctor::LET_TUPLE: {
            TermList binding = sd->getBinding();
            Signature::Symbol* symbol = env.signature->getFunction(sd->getFunctor());
            Substitution subst;
            VList::Iterator vit(sd->getTupleSymbols());
            auto type = symbol->fnType();
            for (unsigned i = 0; i < type->arity(); i++) {
              ASS(vit.hasNext());
              auto var = vit.next();
              TermList sort = AtomicSort::superSort();
              if (i < type->numTypeArguments()) {
                subst.bind(type->quantifiedVar(i).var(), TermList(var, false));
              } else {
                sort = SubstHelper::apply(type->arg(i),subst);
              }
              if (!ignoreBound || !bound.get(var)) {
                if (!map.insert(var, sort)) {
                  ASS_EQ(sort, map.get(var));
                }
              }
            }

            CollectTask newTask(COLLECT_TERMLIST);
            newTask.contextSort = sd->getSort();
            newTask.ts = *term->nthArgument(0);
            todo.push(newTask);

            newTask.contextSort = SubstHelper::apply(type->result(),subst);
            newTask.ts = binding;
            todo.push(newTask);

            break;
          }

          case SpecialFunctor::FORMULA: {
            CollectTask newTask(COLLECT_FORMULA);
            newTask.f = sd->getFormula();
            todo.push(newTask);
          } break;
          case SpecialFunctor::LAMBDA: {
            CollectTask newTask(COLLECT_TERMLIST);
            newTask.contextSort = sd->getLambdaExpSort();
            newTask.ts = sd->getLambdaExp();
            todo.push(newTask);
          } break;

          case SpecialFunctor::TUPLE: {
            CollectTask newTask(COLLECT_TERM);
            newTask.t = sd->getTupleTerm();
            todo.push(newTask);
          } break;

          case SpecialFunctor::MATCH: {
            CollectTask newTask(COLLECT_TERMLIST);
            auto matchedSort = term->getSpecialData()->getMatchedSort();

            // there are two sorts here, one is the sort
            // of matched term and patterns, the other is
            // the sort of the match block and of each case
            newTask.ts = *term->nthArgument(0);
            newTask.contextSort = matchedSort;
            todo.push(newTask);
            for (unsigned int i = 1; i < term->arity(); i += 2) {
              newTask.ts = *term->nthArgument(i);
              newTask.contextSort = matchedSort;
              todo.push(newTask);

              newTask.ts = *term->nthArgument(i + 1);
              newTask.contextSort = sd->getSort();
              todo.push(newTask);
            }
            break;
          }
        }
      } break;

      case COLLECT_FORMULA: {
        Formula* f = task.f;

        switch (f->connective()) {
          case LITERAL: {
            Literal* lit = f->literal();
            if(lit->isTwoVarEquality()){
              CollectTask newTask(COLLECT_TERMLIST);
              newTask.ts = lit->twoVarEqSort();
              newTask.contextSort = AtomicSort::superSort();
              todo.push(newTask);
            }
            CollectTask newTask(COLLECT_TERM);
            newTask.t = lit;

            todo.push(newTask);
            break;
          }

          case BOOL_TERM: {
            TermList ts = f->getBooleanTerm();
            if (ts.isVar()) {
              if (!ignoreBound || !bound.get(ts.var())) {
                if (!map.insert(ts.var(), AtomicSort::boolSort())) {
                  ASS_EQ(AtomicSort::boolSort(), map.get(ts.var()));
                }
              }
            } else {
              ASS(ts.isTerm());

              CollectTask newTask(ts.term()->isSpecial() ? COLLECT_SPECIALTERM : COLLECT_TERM);
              newTask.t = ts.term();
              newTask.contextSort = AtomicSort::boolSort();

              todo.push(newTask);
            }
            break;
          }

          case EXISTS:
          case FORALL: {
            if (ignoreBound) {
              CollectTask unbindTask(UNBIND);
              unbindTask.vars = f->vars();
              todo.push(unbindTask);
            }

            CollectTask newTask(COLLECT_FORMULA);
            newTask.f = f->qarg();
            todo.push(newTask);

            if (ignoreBound) {
              CollectTask bindTask(BIND);
              bindTask.vars = f->vars();
              todo.push(bindTask);
            }
            break;
          }

          case AND:
          case OR: {
            FormulaList::Iterator argIt(f->args());
            while (argIt.hasNext()) {
              CollectTask newTask(COLLECT_FORMULA);
              newTask.f = argIt.next();
              todo.push(newTask);
            }
            break;
          }

          case IMP:
          case IFF:
          case XOR: {
            CollectTask leftTask(COLLECT_FORMULA);
            leftTask.f = f->left();
            todo.push(leftTask);

            CollectTask rightTask(COLLECT_FORMULA);
            rightTask.f = f->right();
            todo.push(rightTask);
            break;
          }

          case NOT: {
            CollectTask newTask(COLLECT_FORMULA);
            newTask.f = f->uarg();
            todo.push(newTask);
            break;
          }

          default:
            continue;
        }
      } break;

      case BIND: {
        VList::Iterator vit(task.vars);
        while (vit.hasNext()) {
          bound.inc(vit.next());
        }
      } break;

      case UNBIND: {
        VList::Iterator vit(task.vars);
        while (vit.hasNext()) {
          bound.dec(vit.next());
        }
      } break;
    }
  }
}